

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O3

void twitter::zipkin::thrift::swap(Span *a,Span *b)

{
  bool bVar1;
  _Span__isset _Var2;
  int64_t iVar3;
  pointer pAVar4;
  pointer pBVar5;
  pointer pAVar6;
  pointer pAVar7;
  pointer pAVar8;
  pointer pBVar9;
  pointer pBVar10;
  pointer pBVar11;
  
  iVar3 = a->trace_id;
  a->trace_id = b->trace_id;
  b->trace_id = iVar3;
  std::__cxx11::string::swap((string *)&a->name);
  iVar3 = a->id;
  a->id = b->id;
  b->id = iVar3;
  iVar3 = a->parent_id;
  a->parent_id = b->parent_id;
  b->parent_id = iVar3;
  pAVar4 = (a->annotations).
           super__Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pAVar6 = (b->annotations).
           super__Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar7 = (a->annotations).
           super__Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar8 = (a->annotations).
           super__Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (a->annotations).
  super__Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (b->annotations).
       super__Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (a->annotations).
  super__Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
  ._M_impl.super__Vector_impl_data._M_finish = pAVar6;
  (b->annotations).
  super__Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
  ._M_impl.super__Vector_impl_data._M_start = pAVar7;
  (b->annotations).
  super__Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
  ._M_impl.super__Vector_impl_data._M_finish = pAVar8;
  pBVar5 = (a->binary_annotations).
           super__Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pBVar9 = (b->binary_annotations).
           super__Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar10 = (a->binary_annotations).
            super__Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar11 = (a->binary_annotations).
            super__Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (a->annotations).
  super__Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (b->annotations).
       super__Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (a->binary_annotations).
  super__Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_start = pBVar9;
  (b->annotations).
  super__Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pAVar4;
  pBVar9 = (b->binary_annotations).
           super__Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (a->binary_annotations).
  super__Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (b->binary_annotations).
       super__Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (a->binary_annotations).
  super__Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pBVar9;
  (b->binary_annotations).
  super__Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_start = pBVar10;
  (b->binary_annotations).
  super__Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_finish = pBVar11;
  (b->binary_annotations).
  super__Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pBVar5;
  bVar1 = a->debug;
  a->debug = b->debug;
  b->debug = bVar1;
  iVar3 = a->timestamp;
  a->timestamp = b->timestamp;
  b->timestamp = iVar3;
  iVar3 = a->duration;
  a->duration = b->duration;
  b->duration = iVar3;
  iVar3 = a->trace_id_high;
  a->trace_id_high = b->trace_id_high;
  b->trace_id_high = iVar3;
  _Var2 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var2;
  return;
}

Assistant:

void swap(Span &a, Span &b) {
  using ::std::swap;
  swap(a.trace_id, b.trace_id);
  swap(a.name, b.name);
  swap(a.id, b.id);
  swap(a.parent_id, b.parent_id);
  swap(a.annotations, b.annotations);
  swap(a.binary_annotations, b.binary_annotations);
  swap(a.debug, b.debug);
  swap(a.timestamp, b.timestamp);
  swap(a.duration, b.duration);
  swap(a.trace_id_high, b.trace_id_high);
  swap(a.__isset, b.__isset);
}